

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcList_item *p)

{
  uint uVar1;
  sqlite3 *psVar2;
  Table *pTVar3;
  Db *pDVar4;
  ulong uVar5;
  Schema **ppSVar6;
  
  if (p->pSchema == (Schema *)0x0) {
    pDVar4 = (Db *)&p->zDatabase;
  }
  else {
    psVar2 = pParse->db;
    uVar1 = psVar2->nDb;
    if ((int)uVar1 < 1) {
      uVar5 = 0;
    }
    else {
      ppSVar6 = &psVar2->aDb->pSchema;
      uVar5 = 0;
      do {
        if (*ppSVar6 == p->pSchema) goto LAB_0015d04f;
        uVar5 = uVar5 + 1;
        ppSVar6 = ppSVar6 + 4;
      } while (uVar1 != uVar5);
      uVar5 = (ulong)uVar1;
    }
LAB_0015d04f:
    pDVar4 = psVar2->aDb + (int)uVar5;
  }
  pTVar3 = sqlite3LocateTable(pParse,flags,p->zName,pDVar4->zDbSName);
  return pTVar3;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse, 
  u32 flags,
  struct SrcList_item *p
){
  const char *zDb;
  assert( p->pSchema==0 || p->zDatabase==0 );
  if( p->pSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    zDb = p->zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}